

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall QPDFWriter::pushMD5Pipeline(QPDFWriter *this,PipelinePopper *pp)

{
  PipelinePopper *pp_00;
  ulong uVar1;
  logic_error *this_00;
  element_type *peVar2;
  qpdf_offset_t qVar3;
  Pl_MD5 *this_01;
  unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_30 [3];
  PipelinePopper *local_18;
  PipelinePopper *pp_local;
  QPDFWriter *this_local;
  
  local_18 = pp;
  pp_local = (PipelinePopper *)this;
  std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,
               "Deterministic ID computation enabled after ID generation has already occurred.");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar2->deterministic_id & 1U) == 0) {
    __assert_fail("m->deterministic_id",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFWriter.cc"
                  ,0x3ff,"void QPDFWriter::pushMD5Pipeline(PipelinePopper &)");
  }
  peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if (peVar2->md5_pipeline != (Pl_MD5 *)0x0) {
    __assert_fail("m->md5_pipeline == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFWriter.cc"
                  ,0x400,"void QPDFWriter::pushMD5Pipeline(PipelinePopper &)");
  }
  peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  qVar3 = ::qpdf::pl::Count::getCount(peVar2->pipeline);
  if (qVar3 == 0) {
    this_01 = (Pl_MD5 *)operator_new(0x50);
    peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    Pl_MD5::Pl_MD5(this_01,"qpdf md5",&peVar2->pipeline->super_Pipeline);
    peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    peVar2->md5_pipeline = this_01;
    peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    Pl_MD5::persistAcrossFinish(peVar2->md5_pipeline,true);
    peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    pushPipeline(this,&peVar2->md5_pipeline->super_Pipeline);
    pp_00 = local_18;
    std::unique_ptr<qpdf::pl::Link,std::default_delete<qpdf::pl::Link>>::
    unique_ptr<std::default_delete<qpdf::pl::Link>,void>
              ((unique_ptr<qpdf::pl::Link,std::default_delete<qpdf::pl::Link>> *)local_30,
               (nullptr_t)0x0);
    activatePipelineStack(this,pp_00,false,(string *)0x0,local_30);
    std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr(local_30);
    return;
  }
  __assert_fail("m->pipeline->getCount() == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFWriter.cc"
                ,0x401,"void QPDFWriter::pushMD5Pipeline(PipelinePopper &)");
}

Assistant:

void
QPDFWriter::pushMD5Pipeline(PipelinePopper& pp)
{
    if (!m->id2.empty()) {
        // Can't happen in the code
        throw std::logic_error(
            "Deterministic ID computation enabled after ID generation has already occurred.");
    }
    qpdf_assert_debug(m->deterministic_id);
    qpdf_assert_debug(m->md5_pipeline == nullptr);
    qpdf_assert_debug(m->pipeline->getCount() == 0);
    m->md5_pipeline = new Pl_MD5("qpdf md5", m->pipeline);
    m->md5_pipeline->persistAcrossFinish(true);
    // Special case code in popPipelineStack clears m->md5_pipeline upon deletion.
    pushPipeline(m->md5_pipeline);
    activatePipelineStack(pp);
}